

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O3

REF_STATUS
ref_clump_zone_around
          (FILE *f,REF_CELL ref_cell,REF_DICT ref_dict,char *zonetype,REF_DICT node_dict,
          REF_NODE ref_node,REF_INT node)

{
  int iVar1;
  REF_DBL *pRVar2;
  REF_CELL pRVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  REF_DICT ref_dict_00;
  REF_INT local;
  REF_DBL xyz_phys [3];
  REF_DBL xyz_comp [3];
  REF_DBL m [6];
  REF_DBL jacob [9];
  REF_INT nodes [27];
  int local_194;
  FILE *local_190;
  REF_DICT local_188;
  REF_DICT local_180;
  REF_CELL local_178;
  long local_170;
  double local_168;
  double local_160;
  double local_158;
  REF_DBL local_148;
  undefined8 local_140;
  undefined8 local_138;
  REF_DBL local_128 [6];
  REF_DBL local_f8 [10];
  REF_INT local_a8 [30];
  
  if (ref_dict->n < 1) {
    uVar4 = 0;
  }
  else {
    local_190 = (FILE *)f;
    local_188 = node_dict;
    uVar4 = ref_node_metric_get(ref_node,node,local_128);
    if (uVar4 == 0) {
      uVar4 = ref_matrix_jacob_m(local_128,local_f8);
      ref_dict_00 = local_188;
      if (uVar4 == 0) {
        local_180 = ref_dict;
        local_178 = ref_cell;
        fprintf(local_190,"zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                zonetype,(ulong)(uint)local_188->n,(ulong)(uint)ref_dict->n,"point",zonetype);
        if (0 < ref_dict_00->n) {
          local_170 = (long)(node * 0xf);
          lVar8 = 0;
          do {
            iVar1 = ref_dict_00->key[lVar8];
            lVar9 = (long)iVar1;
            pRVar2 = ref_node->real;
            local_168 = pRVar2[lVar9 * 0xf] - pRVar2[local_170];
            local_160 = pRVar2[lVar9 * 0xf + 1] - pRVar2[local_170 + 1];
            local_158 = pRVar2[lVar9 * 0xf + 2] - pRVar2[local_170 + 2];
            local_194 = iVar1;
            uVar4 = ref_matrix_vect_mult(local_f8,&local_168,&local_148);
            ref_dict_00 = local_188;
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x3b,"ref_clump_zone_around",(ulong)uVar4,"ax");
              return uVar4;
            }
            lVar6 = -1;
            if (((-1 < iVar1) && (iVar1 < ref_node->max)) &&
               (lVar6 = ref_node->global[lVar9], lVar6 < 0)) {
              lVar6 = -1;
            }
            pRVar2 = ref_node->real;
            fprintf(local_190," %.16e %.16e %.16e %.16e %.16e %.16e %ld\n",pRVar2[lVar9 * 0xf],
                    pRVar2[lVar9 * 0xf + 1],pRVar2[lVar9 * 0xf + 2],local_148,local_140,local_138,
                    lVar6);
            lVar8 = lVar8 + 1;
          } while (lVar8 < ref_dict_00->n);
        }
        if (local_180->n < 1) {
          return 0;
        }
        lVar8 = 0;
        while (pRVar3 = local_178, uVar4 = ref_cell_nodes(local_178,local_180->key[lVar8],local_a8),
              uVar4 == 0) {
          if (0 < pRVar3->node_per) {
            lVar9 = 0;
            do {
              uVar4 = ref_dict_location(ref_dict_00,local_a8[lVar9],&local_194);
              if (uVar4 != 0) {
                pcVar7 = "ret";
                uVar5 = 0x46;
                goto LAB_0020699e;
              }
              fprintf(local_190," %d",(ulong)(local_194 + 1));
              lVar9 = lVar9 + 1;
            } while (lVar9 < local_178->node_per);
          }
          fputc(10,local_190);
          lVar8 = lVar8 + 1;
          if (local_180->n <= lVar8) {
            return 0;
          }
        }
        pcVar7 = "n";
        uVar5 = 0x44;
      }
      else {
        pcVar7 = "jac";
        uVar5 = 0x2d;
      }
    }
    else {
      pcVar7 = "get";
      uVar5 = 0x2c;
    }
LAB_0020699e:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar5,
           "ref_clump_zone_around",(ulong)uVar4,pcVar7);
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_clump_zone_around(
    FILE *f, REF_CELL ref_cell, REF_DICT ref_dict, const char *zonetype,
    REF_DICT node_dict, REF_NODE ref_node, REF_INT node) {
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz_comp[3], xyz_phys[3];
  REF_INT local;
  REF_DBL m[6], jacob[9];

  if (ref_dict_n(ref_dict) <= 0) return REF_SUCCESS;

  RSS(ref_node_metric_get(ref_node, node, m), "get");
  RSS(ref_matrix_jacob_m(m, jacob), "jac");

  fprintf(
      f, "zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      zonetype, ref_dict_n(node_dict), ref_dict_n(ref_dict), "point", zonetype);

  for (item = 0; item < ref_dict_n(node_dict); item++) {
    local = ref_dict_key(node_dict, item);
    xyz_phys[0] =
        ref_node_xyz(ref_node, 0, local) - ref_node_xyz(ref_node, 0, node);
    xyz_phys[1] =
        ref_node_xyz(ref_node, 1, local) - ref_node_xyz(ref_node, 1, node);
    xyz_phys[2] =
        ref_node_xyz(ref_node, 2, local) - ref_node_xyz(ref_node, 2, node);
    RSS(ref_matrix_vect_mult(jacob, xyz_phys, xyz_comp), "ax");
    fprintf(f, " %.16e %.16e %.16e %.16e %.16e %.16e " REF_GLOB_FMT "\n",
            ref_node_xyz(ref_node, 0, local), ref_node_xyz(ref_node, 1, local),
            ref_node_xyz(ref_node, 2, local), xyz_comp[0], xyz_comp[1],
            xyz_comp[2], ref_node_global(ref_node, local));
  }

  for (item = 0; item < ref_dict_n(ref_dict); item++) {
    cell = ref_dict_key(ref_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
      fprintf(f, " %d", local + 1);
    }
    fprintf(f, "\n");
  }

  return REF_SUCCESS;
}